

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O2

void __thiscall Js::JavascriptStaticEnumerator::Reset(JavascriptStaticEnumerator *this)

{
  JavascriptEnumerator *pJVar1;
  
  pJVar1 = (this->prefixEnumerator).ptr;
  if (pJVar1 == (JavascriptEnumerator *)0x0) {
    if ((this->arrayEnumerator).ptr == (JavascriptEnumerator *)0x0) goto LAB_00c4554e;
    Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=
              (&this->currentEnumerator,&this->arrayEnumerator);
    pJVar1 = (this->arrayEnumerator).ptr;
  }
  else {
    (*(pJVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x62])();
    Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=
              (&this->currentEnumerator,&this->prefixEnumerator);
    pJVar1 = (this->arrayEnumerator).ptr;
    if (pJVar1 == (JavascriptEnumerator *)0x0) goto LAB_00c4554e;
  }
  (*(pJVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])();
LAB_00c4554e:
  DynamicObjectPropertyEnumerator::Reset(&this->propertyEnumerator);
  return;
}

Assistant:

void JavascriptStaticEnumerator::Reset()
    {
        if (this->prefixEnumerator)
        {
            this->prefixEnumerator->Reset();
            this->currentEnumerator = this->prefixEnumerator;
            if (this->arrayEnumerator)
            {
                this->arrayEnumerator->Reset();
            }
        }
        else if (this->arrayEnumerator)
        {
            this->currentEnumerator = this->arrayEnumerator;
            this->arrayEnumerator->Reset();
        }
        this->propertyEnumerator.Reset();
    }